

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteGenericLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddOperator,bool>
               (interval_t *ldata,interval_t *rdata,interval_t *result_data,SelectionVector *lsel,
               SelectionVector *rsel,idx_t count,ValidityMask *lvalidity,ValidityMask *rvalidity,
               ValidityMask *result_validity,bool fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t row_idx;
  int64_t *piVar13;
  idx_t row_idx_00;
  idx_t row_idx_01;
  interval_t left;
  interval_t iVar14;
  interval_t right;
  interval_t right_00;
  
  if ((rvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (lvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    piVar13 = &result_data->micros;
    for (uVar12 = 0; count != uVar12; uVar12 = uVar12 + 1) {
      uVar10 = uVar12;
      if (lsel->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)lsel->sel_vector[uVar12];
      }
      uVar11 = uVar12;
      if (rsel->sel_vector != (sel_t *)0x0) {
        uVar11 = (ulong)rsel->sel_vector[uVar12];
      }
      uVar1 = ldata[uVar10].months;
      uVar5 = ldata[uVar10].days;
      left.days = uVar5;
      left.months = uVar1;
      uVar2 = rdata[uVar11].months;
      uVar6 = rdata[uVar11].days;
      right.days = uVar6;
      right.months = uVar2;
      left.micros = ldata[uVar10].micros;
      right.micros = rdata[uVar11].micros;
      iVar14 = AddOperator::Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                         (left,right);
      ((interval_t *)(piVar13 + -1))->months = (int)iVar14._0_8_;
      ((interval_t *)(piVar13 + -1))->days = (int)((ulong)iVar14._0_8_ >> 0x20);
      *piVar13 = iVar14.micros;
      piVar13 = piVar13 + 2;
    }
  }
  else {
    piVar13 = &result_data->micros;
    for (row_idx_00 = 0; count != row_idx_00; row_idx_00 = row_idx_00 + 1) {
      row_idx_01 = row_idx_00;
      if (lsel->sel_vector != (sel_t *)0x0) {
        row_idx_01 = (idx_t)lsel->sel_vector[row_idx_00];
      }
      row_idx = row_idx_00;
      if (rsel->sel_vector != (sel_t *)0x0) {
        row_idx = (idx_t)rsel->sel_vector[row_idx_00];
      }
      bVar9 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&lvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
      if (bVar9) {
        bVar9 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&rvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx);
        if (!bVar9) goto LAB_014d2f37;
        uVar3 = ldata[row_idx_01].months;
        uVar7 = ldata[row_idx_01].days;
        iVar14.days = uVar7;
        iVar14.months = uVar3;
        uVar4 = rdata[row_idx].months;
        uVar8 = rdata[row_idx].days;
        right_00.days = uVar8;
        right_00.months = uVar4;
        iVar14.micros = ldata[row_idx_01].micros;
        right_00.micros = rdata[row_idx].micros;
        iVar14 = AddOperator::Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                           (iVar14,right_00);
        ((interval_t *)(piVar13 + -1))->months = (int)iVar14._0_8_;
        ((interval_t *)(piVar13 + -1))->days = (int)((ulong)iVar14._0_8_ >> 0x20);
        *piVar13 = iVar14.micros;
      }
      else {
LAB_014d2f37:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
      }
      piVar13 = piVar13 + 2;
    }
  }
  return;
}

Assistant:

static void ExecuteGenericLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                               RESULT_TYPE *__restrict result_data, const SelectionVector *__restrict lsel,
	                               const SelectionVector *__restrict rsel, idx_t count, ValidityMask &lvalidity,
	                               ValidityMask &rvalidity, ValidityMask &result_validity, FUNC fun) {
		if (!lvalidity.AllValid() || !rvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto lindex = lsel->get_index(i);
				auto rindex = rsel->get_index(i);
				if (lvalidity.RowIsValid(lindex) && rvalidity.RowIsValid(rindex)) {
					auto lentry = ldata[lindex];
					auto rentry = rdata[rindex];
					result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
					    fun, lentry, rentry, result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[lsel->get_index(i)];
				auto rentry = rdata[rsel->get_index(i)];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, result_validity, i);
			}
		}
	}